

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall
kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_>::ensureStringifiedInitialized
          (Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *this)

{
  anon_class_1_0_00000001 local_31;
  Mapper<kj::ArrayPtr<kj::ArrayPtr<int>_>_&> local_30;
  Array<kj::_::Delimited<kj::ArrayPtr<int>_>_> local_28;
  
  if (((this->array).size_ != 0) && ((this->stringified).size_ == 0)) {
    local_30.array = &this->array;
    Mapper<kj::ArrayPtr<kj::ArrayPtr<int>_>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_string_h:886:21)>
              (&local_28,&local_30,&local_31);
    Array<kj::_::Delimited<kj::ArrayPtr<int>_>_>::operator=(&this->stringified,&local_28);
    Array<kj::_::Delimited<kj::ArrayPtr<int>_>_>::~Array(&local_28);
  }
  return;
}

Assistant:

void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }